

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseBase.h
# Opt level: O1

void __thiscall
Eigen::
DenseBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>,1,-1,false>>
::
swap<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,1,_1,false>>
          (DenseBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,1,_1,false>>
           *this,DenseBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1,__1,_false>_>
                 *other,int param_2)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  
  lVar4 = *(long *)(this + 0x10);
  if (lVar4 == *(long *)(other + 0x10)) {
    if (0 < lVar4) {
      puVar5 = *(undefined8 **)this;
      lVar2 = *(long *)(this + 0x50);
      puVar6 = *(undefined8 **)other;
      lVar3 = *(long *)(other + 0x50);
      do {
        uVar1 = *puVar5;
        *puVar5 = *puVar6;
        *puVar6 = uVar1;
        puVar6 = puVar6 + lVar3;
        puVar5 = puVar5 + lVar2;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    return;
  }
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/Assign.h"
                ,0x1f9,
                "Derived &Eigen::DenseBase<Eigen::SwapWrapper<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>, 1>>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::SwapWrapper<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>, 1>>, OtherDerived = Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>, 1>]"
               );
}

Assistant:

void swap(const DenseBase<OtherDerived>& other,
              int = OtherDerived::ThisConstantIsPrivateInPlainObjectBase)
    {
      SwapWrapper<Derived>(derived()).lazyAssign(other.derived());
    }